

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O3

void __thiscall wasm::DataFlowOpts::workOn(DataFlowOpts *this,Node *node)

{
  pointer ppNVar1;
  Node *with;
  bool bVar2;
  Index IVar3;
  Type TVar4;
  
  if (((node->type != Expr) || (((node->field_1).expr)->_id != ConstId)) &&
     (IVar3 = DataFlow::Users::getNumUses(&this->nodeUsers,node), IVar3 != 0)) {
    TVar4 = node->type;
    if (TVar4 == Phi) {
      bVar2 = DataFlow::allInputsIdentical(node);
      if (bVar2) {
        ppNVar1 = (node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(node->values).
                          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) < 2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
        }
        with = ppNVar1[1];
        if (with->type != Expr) {
          return;
        }
        if (((with->field_1).expr)->_id != ConstId) {
          return;
        }
        replaceAllUsesWith(this,node,with);
        return;
      }
      TVar4 = node->type;
    }
    if ((TVar4 == Expr) && (bVar2 = DataFlow::allInputsConstant(node), bVar2)) {
      if ((node->type == Expr) && (((node->field_1).expr)->_id == ConstId)) {
        __assert_fail("!node->isConst()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                      ,0x69,"void wasm::DataFlowOpts::workOn(DataFlow::Node *)");
      }
      if (1 < (((node->field_1).expr)->type).id) {
        optimizeExprToConstant(this,node);
        return;
      }
    }
  }
  return;
}

Assistant:

void workOn(DataFlow::Node* node) {
    if (node->isConst()) {
      return;
    }
    // If there are no uses, there is no point to work.
    if (nodeUsers.getNumUses(node) == 0) {
      return;
    }
    // Optimize: Look for nodes that we can easily convert into
    // something simpler.
    // TODO: we can expressionify and run full normal opts on that,
    //       then copy the result if it's smaller.
    if (node->isPhi() && DataFlow::allInputsIdentical(node)) {
      // Note we don't need to check for effects when replacing, as in
      // flattened IR expression children are local.gets or consts.
      auto* value = node->getValue(1);
      if (value->isConst()) {
        replaceAllUsesWith(node, value);
      }
    } else if (node->isExpr() && DataFlow::allInputsConstant(node)) {
      assert(!node->isConst());
      // If this is a concrete value (not e.g. an eqz of unreachable),
      // it can definitely be precomputed into a constant.
      if (node->expr->type.isConcrete()) {
        // This can be precomputed.
        // TODO not just all-constant inputs? E.g. i32.mul of 0 and X.
        optimizeExprToConstant(node);
      }
    }
  }